

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailureTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_TestFailure_BinaryEqualOneByte_TestShell::createTest
          (TEST_TestFailure_BinaryEqualOneByte_TestShell *this)

{
  TEST_TestFailure_BinaryEqualOneByte_Test *this_00;
  TEST_TestFailure_BinaryEqualOneByte_TestShell *this_local;
  
  this_00 = (TEST_TestFailure_BinaryEqualOneByte_Test *)
            operator_new(0x10,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestFailureTest.cpp"
                         ,0x142);
  TEST_TestFailure_BinaryEqualOneByte_Test::TEST_TestFailure_BinaryEqualOneByte_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(TestFailure, BinaryEqualOneByte)
{
    const unsigned char expectedData[] = { 0x00 };
    const unsigned char actualData[] = { 0x01 };
    BinaryEqualFailure f(test, failFileName, failLineNumber, expectedData, actualData, sizeof(expectedData), "");
    FAILURE_EQUAL("expected <00>\n"
                "\tbut was  <01>\n"
    			"\tdifference starts at position 0 at: <         01         >\n"
    			"\t                                               ^", f);
}